

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor,sqlite_int64 *pRowid)

{
  RtreeNode *pNode_00;
  sqlite3_vtab *psVar1;
  RtreeNode *pNode;
  RtreeSearchPoint *pRStack_28;
  int rc;
  RtreeSearchPoint *p;
  RtreeCursor *pCsr;
  sqlite_int64 *pRowid_local;
  sqlite3_vtab_cursor *pVtabCursor_local;
  
  p = (RtreeSearchPoint *)pVtabCursor;
  pCsr = (RtreeCursor *)pRowid;
  pRowid_local = (sqlite_int64 *)pVtabCursor;
  pRStack_28 = rtreeSearchPointFirst((RtreeCursor *)pVtabCursor);
  pNode._4_4_ = 0;
  pNode_00 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)p,(int *)((long)&pNode + 4));
  if ((pNode._4_4_ == 0) && (pRStack_28 != (RtreeSearchPoint *)0x0)) {
    psVar1 = (sqlite3_vtab *)nodeGetRowid((Rtree *)p->rScore,pNode_00,(uint)pRStack_28->iCell);
    (pCsr->base).pVtab = psVar1;
  }
  return pNode._4_4_;
}

Assistant:

static int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor, sqlite_int64 *pRowid){
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);
  if( rc==SQLITE_OK && p ){
    *pRowid = nodeGetRowid(RTREE_OF_CURSOR(pCsr), pNode, p->iCell);
  }
  return rc;
}